

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector u,N_Vector fu,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long in_RCX;
  undefined8 in_RDX;
  UserData data;
  sunrealtype verdc;
  sunrealtype horac;
  sunrealtype hordc;
  sunrealtype *kthCol;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  long local_48;
  long local_40;
  
  dVar1 = *(double *)(in_RCX + 0x10);
  dVar2 = *(double *)(in_RCX + 0x18);
  dVar3 = *(double *)(in_RCX + 0x20);
  for (local_48 = 1; local_48 < 6; local_48 = local_48 + 1) {
    for (local_40 = 1; local_40 < 0xb; local_40 = local_40 + 1) {
      pdVar4 = (double *)SUNBandMatrix_Column(in_RDX,local_48 + -1 + (local_40 + -1) * 5);
      *pdVar4 = (dVar3 + dVar1) * -2.0;
      if (local_40 != 1) {
        pdVar4[-5] = dVar1 + dVar2;
      }
      if (local_40 != 10) {
        pdVar4[5] = dVar1 - dVar2;
      }
      if (local_48 != 1) {
        pdVar4[-1] = dVar3;
      }
      if (local_48 != 5) {
        pdVar4[1] = dVar3;
      }
    }
  }
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector u, N_Vector fu, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunindextype i, j, k;
  sunrealtype *kthCol, hordc, horac, verdc;
  UserData data;

  /*
   * The components of f = udot that depend on u(i,j) are
   * f(i,j), f(i-1,j), f(i+1,j), f(i,j-1), f(i,j+1), with
   *   df(i,j)/du(i,j) = -2 (1/dx^2 + 1/dy^2)
   *   df(i-1,j)/du(i,j) = 1/dx^2 + .25/dx  (if i > 1)
   *   df(i+1,j)/du(i,j) = 1/dx^2 - .25/dx  (if i < MX)
   *   df(i,j-1)/du(i,j) = 1/dy^2           (if j > 1)
   *   df(i,j+1)/du(i,j) = 1/dy^2           (if j < MY)
   */

  data  = (UserData)user_data;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  SUNDIALS_MARK_BEGIN(data->profobj, "Jac");

  /* set non-zero Jacobian entries */
  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      k      = j - 1 + (i - 1) * MY;
      kthCol = SUNBandMatrix_Column(J, k);

      /* set the kth column of J */

      SM_COLUMN_ELEMENT_B(kthCol, k, k) = -TWO * (verdc + hordc);
      if (i != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - MY, k) = hordc + horac; }
      if (i != MX) { SM_COLUMN_ELEMENT_B(kthCol, k + MY, k) = hordc - horac; }
      if (j != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - 1, k) = verdc; }
      if (j != MY) { SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = verdc; }
    }
  }

  SUNDIALS_MARK_END(data->profobj, "Jac");

  return (0);
}